

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
helics::createMessageFromCommand(ActionMessage *cmd)

{
  size_type sVar1;
  pointer pMVar2;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  __single_object *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  long lVar3;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff62;
  uint16_t uVar4;
  undefined4 in_stack_ffffffffffffff64;
  int32_t iVar5;
  SmallBuffer *in_stack_ffffffffffffff70;
  SmallBuffer *in_stack_ffffffffffffff78;
  
  std::make_unique<helics::Message>();
  sVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0));
  switch(sVar1) {
  case 0:
    break;
  case 1:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x52ff48);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    break;
  case 2:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x52ffaa);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x52ffe5);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    break;
  case 3:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x530027);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x530062);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),2);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5300a0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    break;
  default:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),0);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5300e2);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0xa0),1);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x53011d);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff78 =
         (SmallBuffer *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0xa0),2);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x53015b);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff70 =
         (SmallBuffer *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RSI + 0xa0),3);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x530199);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
               in_stack_ffffffffffffff58);
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5301cc);
  SmallBuffer::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  lVar3 = in_RSI;
  pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x5301f5
                     );
  (pMVar2->time).internalTimeCode = *(baseType *)(lVar3 + 0x20);
  uVar4 = *(uint16_t *)(in_RSI + 0x1a);
  pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x53021b
                     );
  pMVar2->flags = uVar4;
  iVar5 = *(int32_t *)(in_RSI + 4);
  pMVar2 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                     ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x53023d
                     );
  pMVar2->messageID = iVar5;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> createMessageFromCommand(const ActionMessage& cmd)
{
    auto msg = std::make_unique<Message>();
    switch (cmd.stringData.size()) {
        case 0:
            break;
        case 1:
            msg->dest = cmd.stringData[0];
            break;
        case 2:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            break;
        case 3:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            msg->original_source = cmd.stringData[2];
            break;
        default:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            msg->original_source = cmd.stringData[2];
            msg->original_dest = cmd.stringData[3];
            break;
    }
    msg->data = cmd.payload;
    msg->time = cmd.actionTime;
    msg->flags = cmd.flags;
    msg->messageID = cmd.messageID;

    return msg;
}